

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_filter.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalFilter::ExecuteInternal
          (PhysicalFilter *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state_p)

{
  idx_t count_p;
  
  count_p = ExpressionExecutor::SelectExpression
                      ((ExpressionExecutor *)(state_p + 3),input,(SelectionVector *)(state_p + 0xc))
  ;
  if (count_p == input->count) {
    DataChunk::Reference(chunk,input);
  }
  else {
    DataChunk::Slice(chunk,input,(SelectionVector *)(state_p + 0xc),count_p,0);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalFilter::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   GlobalOperatorState &gstate, OperatorState &state_p) const {
	auto &state = state_p.Cast<FilterState>();
	idx_t result_count = state.executor.SelectExpression(input, state.sel);
	if (result_count == input.size()) {
		// nothing was filtered: skip adding any selection vectors
		chunk.Reference(input);
	} else {
		chunk.Slice(input, state.sel, result_count);
	}
	return OperatorResultType::NEED_MORE_INPUT;
}